

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binomial_heap.cpp
# Opt level: O1

BinomialNode * binomial_node_make(int index,Type key)

{
  BinomialNode *pBVar1;
  
  pBVar1 = (BinomialNode *)malloc(0x28);
  if (pBVar1 != (BinomialNode *)0x0) {
    pBVar1->index = index;
    pBVar1->key = key;
    pBVar1->degree = 0;
    pBVar1->p = (_BinomialNode *)0x0;
    pBVar1->child = (_BinomialNode *)0x0;
    pBVar1->sibling = (_BinomialNode *)0x0;
    return pBVar1;
  }
  printf("memory allocation of node failed");
  exit(-1);
}

Assistant:

BinomialNode *binomial_node_make(int index, Type key) {
    BinomialNode *x = (BinomialNode *) malloc(sizeof(BinomialNode));
    //if fail to alloc the space, print the exception and exit
    if (x == NULL) {
        printf("memory allocation of node failed");
        exit(-1);
    }
    x->index = index;
    x->key = key;
    x->p = NULL;
    x->child = NULL;
    x->sibling = NULL;
    x->degree = 0;
    return x;
}